

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall foxxll::config::~config(config *this)

{
  pointer pdVar1;
  ostream local_1a0 [376];
  
  this->_vptr_config = (_func_int **)&PTR__config_00167620;
  for (pdVar1 = (this->disks_list).
                super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar1 != (this->disks_list).
                super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                _M_impl.super__Vector_impl_data._M_finish; pdVar1 = pdVar1 + 1) {
    if (pdVar1->delete_on_exit == true) {
      tlx::Logger::Logger((Logger *)local_1a0);
      std::operator<<(local_1a0,"foxxll: Removing disk file: ");
      std::operator<<(local_1a0,(string *)pdVar1);
      tlx::Logger::~Logger((Logger *)local_1a0);
      unlink((pdVar1->path)._M_dataplus._M_p);
    }
  }
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::~vector(&this->disks_list)
  ;
  return;
}

Assistant:

config::~config()
{
    for (disk_list_type::const_iterator it = disks_list.begin();
         it != disks_list.end(); it++)
    {
        if (it->delete_on_exit)
        {
            TLX_LOG1 << "foxxll: Removing disk file: " << it->path;
            unlink(it->path.c_str());
        }
    }
}